

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::BeginSnapshot
          (SnapshotExtractor *this,ThreadContext *threadContext,double gcTime)

{
  bool bVar1;
  HeapAllocator *alloc;
  SnapShot *pSVar2;
  TrackAllocData local_48;
  double local_20;
  double gcTime_local;
  ThreadContext *threadContext_local;
  SnapshotExtractor *this_local;
  
  pSVar2 = this->m_pendingSnap;
  local_20 = gcTime;
  gcTime_local = (double)threadContext;
  threadContext_local = (ThreadContext *)this;
  bVar1 = JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Empty(&this->m_worklist);
  if (pSVar2 != (SnapShot *)0x0 || !bVar1) {
    TTDAbort_unrecoverable_error("Something went wrong.");
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&SnapShot::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapshotExtractor.cpp"
             ,0x15f);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  pSVar2 = (SnapShot *)new<Memory::HeapAllocator>(0x1f8,alloc,true,0x469be0);
  SnapShot::SnapShot(pSVar2,local_20);
  pSVar2 = TTD_MEM_ALLOC_CHECK<TTD::SnapShot>(pSVar2);
  this->m_pendingSnap = pSVar2;
  return;
}

Assistant:

void SnapshotExtractor::BeginSnapshot(ThreadContext* threadContext, double gcTime)
    {
        TTDAssert((this->m_pendingSnap == nullptr) & this->m_worklist.Empty(), "Something went wrong.");

        this->m_pendingSnap = TT_HEAP_NEW(SnapShot, gcTime);
    }